

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O1

Path * __thiscall tinyusdz::Path::AppendPrim(Path *__return_storage_ptr__,Path *this,string *elem)

{
  Path local_e8;
  
  Path(__return_storage_ptr__,this);
  append_element(&local_e8,__return_storage_ptr__,elem);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._element._M_dataplus._M_p != &local_e8._element.field_2) {
    operator_delete(local_e8._element._M_dataplus._M_p,
                    local_e8._element.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._variant_part_str._M_dataplus._M_p != &local_e8._variant_part_str.field_2) {
    operator_delete(local_e8._variant_part_str._M_dataplus._M_p,
                    local_e8._variant_part_str.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._variant_selection_part._M_dataplus._M_p !=
      &local_e8._variant_selection_part.field_2) {
    operator_delete(local_e8._variant_selection_part._M_dataplus._M_p,
                    local_e8._variant_selection_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._variant_part._M_dataplus._M_p != &local_e8._variant_part.field_2) {
    operator_delete(local_e8._variant_part._M_dataplus._M_p,
                    local_e8._variant_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._prop_part._M_dataplus._M_p != &local_e8._prop_part.field_2) {
    operator_delete(local_e8._prop_part._M_dataplus._M_p,
                    local_e8._prop_part.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._prim_part._M_dataplus._M_p != &local_e8._prim_part.field_2) {
    operator_delete(local_e8._prim_part._M_dataplus._M_p,
                    local_e8._prim_part.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

const Path Path::AppendPrim(const std::string &elem) const {
  Path p = (*this);  // copies

  p.append_prim(elem);

  return p;
}